

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::operator/=(path *this,path *p)

{
  char cVar1;
  size_type sVar2;
  const_iterator cVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  pointer pcVar8;
  char cVar9;
  bool bVar10;
  iterator iter;
  const_iterator local_148;
  const_iterator local_140;
  path local_138;
  const_iterator local_118;
  iterator local_110;
  path local_d0;
  impl_string_type local_b0;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  path local_50;
  
  cVar9 = (char)this;
  if ((p->_path)._M_string_length == 0) {
    sVar2 = (this->_path)._M_string_length;
    if (sVar2 == 0) {
      return this;
    }
    cVar1 = (this->_path)._M_dataplus._M_p[sVar2 - 1];
    if (cVar1 == '/') {
      return this;
    }
    if (cVar1 == ':') {
      return this;
    }
    std::__cxx11::string::push_back(cVar9);
    return this;
  }
  bVar5 = has_root_directory(p);
  if (bVar5) {
    pcVar8 = (this->_path)._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_b0,pcVar8,pcVar8 + (this->_path)._M_string_length);
    postprocess_path_with_format(&local_b0,(format)pcVar8);
    root_name(&local_138,this);
    if ((local_b0._M_string_length == local_138._path._M_string_length) &&
       (((local_b0._M_string_length == 0 ||
         (iVar7 = bcmp(local_b0._M_dataplus._M_p,local_138._path._M_dataplus._M_p,
                       local_b0._M_string_length), iVar7 == 0)) &&
        (iVar7 = std::__cxx11::string::compare((char *)p), iVar7 == 0)))) goto LAB_001523aa;
    bVar5 = true;
    bVar10 = false;
  }
  else {
LAB_001523aa:
    bVar6 = has_root_name(p);
    if (!bVar6) {
      bVar6 = false;
      bVar10 = false;
      goto LAB_0015241f;
    }
    root_name(&local_d0,p);
    root_name(&local_50,this);
    bVar6 = true;
    bVar10 = true;
    if (local_d0._path._M_string_length == local_50._path._M_string_length) {
      if (local_d0._path._M_string_length == 0) {
        bVar10 = false;
      }
      else {
        iVar7 = bcmp(local_d0._path._M_dataplus._M_p,local_50._path._M_dataplus._M_p,
                     local_d0._path._M_string_length);
        bVar10 = iVar7 != 0;
      }
      goto LAB_0015241f;
    }
  }
  bVar6 = bVar10;
  bVar10 = true;
LAB_0015241f:
  if (bVar6) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._path._M_dataplus._M_p != &local_50._path.field_2) {
      operator_delete(local_50._path._M_dataplus._M_p,
                      local_50._path.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._path._M_dataplus._M_p != &local_d0._path.field_2) {
      operator_delete(local_d0._path._M_dataplus._M_p,
                      local_d0._path.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar5 != false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._path._M_dataplus._M_p != &local_138._path.field_2) {
      operator_delete(local_138._path._M_dataplus._M_p,
                      local_138._path.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar10) {
    std::__cxx11::string::_M_assign((string *)this);
  }
  else {
    bVar5 = has_root_directory(p);
    if (bVar5) {
      root_name((path *)local_90,this);
      std::__cxx11::string::_M_assign((string *)this);
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
    }
    else {
      bVar5 = has_root_directory(this);
      if (((!bVar5) && (bVar5 = has_root_directory(this), bVar5)) ||
         (bVar5 = has_filename(this), bVar5)) {
        std::__cxx11::string::push_back(cVar9);
      }
    }
    local_148._M_current = (p->_path)._M_dataplus._M_p;
    local_140._M_current = local_148._M_current + (p->_path)._M_string_length;
    local_110._first._M_current = local_148._M_current;
    iterator::iterator((iterator *)local_90,&local_110._first,&local_140,&local_148);
    bVar5 = has_root_name(p);
    if (bVar5) {
      iterator::operator++((iterator *)local_90);
    }
    bVar5 = true;
    while( true ) {
      local_140._M_current = (p->_path)._M_dataplus._M_p;
      local_148._M_current = local_140._M_current + (p->_path)._M_string_length;
      local_118._M_current = local_148._M_current;
      iterator::iterator(&local_110,&local_140,&local_148,&local_118);
      uVar4 = local_90._24_8_;
      cVar3._M_current = local_110._iter._M_current;
      iVar7 = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._current._path._M_dataplus._M_p != &local_110._current._path.field_2) {
        operator_delete(local_110._current._path._M_dataplus._M_p,
                        local_110._current._path.field_2._M_allocated_capacity + 1);
        iVar7 = extraout_EDX_00;
      }
      if ((char *)uVar4 == cVar3._M_current) break;
      if ((!bVar5) &&
         ((sVar2 = (this->_path)._M_string_length, sVar2 == 0 ||
          ((this->_path)._M_dataplus._M_p[sVar2 - 1] != '/')))) {
        std::__cxx11::string::push_back(cVar9);
        iVar7 = extraout_EDX_01;
      }
      iterator::operator++(&local_110,(iterator *)local_90,iVar7);
      std::__cxx11::string::_M_append((char *)this,(ulong)local_110._current._path._M_dataplus._M_p)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._current._path._M_dataplus._M_p != &local_110._current._path.field_2) {
        operator_delete(local_110._current._path._M_dataplus._M_p,
                        local_110._current._path.field_2._M_allocated_capacity + 1);
      }
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
  }
  return this;
}

Assistant:

GHC_INLINE path& path::operator/=(const path& p)
{
    if (p.empty()) {
        // was: if ((!has_root_directory() && is_absolute()) || has_filename())
        if (!_path.empty() && _path[_path.length() - 1] != '/' && _path[_path.length() - 1] != ':') {
            _path += '/';
        }
        return *this;
    }
    if ((p.is_absolute() && (_path != root_name() || p._path != "/")) || (p.has_root_name() && p.root_name() != root_name())) {
        assign(p);
        return *this;
    }
    if (p.has_root_directory()) {
        assign(root_name());
    }
    else if ((!has_root_directory() && is_absolute()) || has_filename()) {
        _path += '/';
    }
    auto iter = p.begin();
    bool first = true;
    if (p.has_root_name()) {
        ++iter;
    }
    while (iter != p.end()) {
        if (!first && !(!_path.empty() && _path[_path.length() - 1] == '/')) {
            _path += '/';
        }
        first = false;
        _path += (*iter++).generic_string();
    }
    return *this;
}